

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_uint32 ma_pcm_rb_available_read(ma_pcm_rb *pRB)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  ma_pcm_rb *pRB_local;
  
  if (pRB == (ma_pcm_rb *)0x0) {
    pRB_local._4_4_ = 0;
  }
  else {
    mVar2 = ma_rb_available_read(&pRB->rb);
    if (pRB == (ma_pcm_rb *)0x0) {
      __assert_fail("pRB != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0xaade,"ma_uint32 ma_pcm_rb_get_bpf(ma_pcm_rb *)");
    }
    mVar1 = pRB->channels;
    mVar3 = ma_get_bytes_per_sample(pRB->format);
    pRB_local._4_4_ = mVar2 / (mVar3 * mVar1);
  }
  return pRB_local._4_4_;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_available_read(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_available_read(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}